

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::FileGenerator::~FileGenerator(FileGenerator *this)

{
  iterator begin;
  iterator end;
  iterator begin_00;
  iterator end_00;
  iterator begin_01;
  iterator end_01;
  FileGenerator *this_local;
  
  begin = std::
          vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
          ::begin(&this->enum_generators_);
  end = std::
        vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
        ::end(&this->enum_generators_);
  STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator**,std::vector<google::protobuf::compiler::objectivec::EnumGenerator*,std::allocator<google::protobuf::compiler::objectivec::EnumGenerator*>>>>
            ((__normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
              )begin._M_current,
             (__normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
              )end._M_current);
  begin_00 = std::
             vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
             ::begin(&this->message_generators_);
  end_00 = std::
           vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
           ::end(&this->message_generators_);
  STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator**,std::vector<google::protobuf::compiler::objectivec::MessageGenerator*,std::allocator<google::protobuf::compiler::objectivec::MessageGenerator*>>>>
            ((__normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
              )begin_00._M_current,
             (__normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
              )end_00._M_current);
  begin_01 = std::
             vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
             ::begin(&this->extension_generators_);
  end_01 = std::
           vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
           ::end(&this->extension_generators_);
  STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::compiler::objectivec::ExtensionGenerator**,std::vector<google::protobuf::compiler::objectivec::ExtensionGenerator*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator*>>>>
            ((__normal_iterator<google::protobuf::compiler::objectivec::ExtensionGenerator_**,_std::vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>_>
              )begin_01._M_current,
             (__normal_iterator<google::protobuf::compiler::objectivec::ExtensionGenerator_**,_std::vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>_>
              )end_01._M_current);
  Options::~Options(&this->options_);
  std::
  vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ::~vector(&this->extension_generators_);
  std::
  vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
  ::~vector(&this->message_generators_);
  std::
  vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
  ::~vector(&this->enum_generators_);
  std::__cxx11::string::~string((string *)&this->root_class_name_);
  return;
}

Assistant:

FileGenerator::~FileGenerator() {
  STLDeleteContainerPointers(enum_generators_.begin(), enum_generators_.end());
  STLDeleteContainerPointers(message_generators_.begin(),
                             message_generators_.end());
  STLDeleteContainerPointers(extension_generators_.begin(),
                             extension_generators_.end());
}